

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

Action<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)> * __thiscall
testing::internal::OnCallSpec<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)>::GetAction
          (OnCallSpec<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)> *this)

{
  int iVar1;
  allocator<char> local_39;
  string local_38;
  
  iVar1 = *(int *)(this + 0xc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,".WillByDefault() must appear exactly once in an ON_CALL().",
             &local_39);
  UntypedOnCallSpecBase::AssertSpecProperty((UntypedOnCallSpecBase *)this,iVar1 == 2,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return (Action<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)> *)(this + 0x70);
}

Assistant:

const Action<F>& GetAction() const {
    AssertSpecProperty(last_clause_ == kWillByDefault,
                       ".WillByDefault() must appear exactly "
                       "once in an ON_CALL().");
    return action_;
  }